

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Part::SetVisualizationType(RS_Part *this,VisualizationType vis)

{
  bool bVar1;
  shared_ptr<chrono::ChVisualModel> local_38;
  shared_ptr<chrono::ChVisualModel> local_28;
  VisualizationType local_14;
  RS_Part *pRStack_10;
  VisualizationType vis_local;
  RS_Part *this_local;
  
  local_14 = vis;
  pRStack_10 = this;
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->m_body);
  chrono::ChPhysicsItem::GetVisualModel();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  std::shared_ptr<chrono::ChVisualModel>::~shared_ptr(&local_28);
  if (bVar1) {
    std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_body);
    chrono::ChPhysicsItem::GetVisualModel();
    std::__shared_ptr_access<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&local_38);
    chrono::ChVisualModel::Clear();
    std::shared_ptr<chrono::ChVisualModel>::~shared_ptr(&local_38);
  }
  AddVisualizationAssets(this,local_14);
  return;
}

Assistant:

void RS_Part::SetVisualizationType(VisualizationType vis) {
    if (m_body->GetVisualModel())
        m_body->GetVisualModel()->Clear();

    AddVisualizationAssets(vis);
}